

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::CVmObjGramProd(CVmObjGramProd *this)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  vm_gram_ext *pvVar3;
  CVmGramProdMem *this_00;
  vmgram_match_info *pvVar4;
  CVmObject *in_RDI;
  
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003e5260;
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x48,in_RDI);
  in_RDI->ext_ = (char *)CONCAT44(extraout_var,iVar1);
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->image_data_ = (char *)0x0;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->image_data_size_ = 0;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->field_0x14 = pvVar3->field_0x14 & 0xfe;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->alts_ = (vmgram_alt_info **)0x0;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->alt_cnt_ = 0;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->alt_alo_ = 0;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->field_0x14 = pvVar3->field_0x14 & 0xfd;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->comparator_ = 0;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->field_0x14 = pvVar3->field_0x14 & 0xfb;
  this_00 = (CVmGramProdMem *)operator_new(0x20);
  CVmGramProdMem::CVmGramProdMem(this_00);
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->mem_ = this_00;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->prop_enum_max_ = 0x40;
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar4 = (vmgram_match_info *)malloc(pvVar3->prop_enum_max_ << 1);
  pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar3->prop_enum_arr_ = pvVar4;
  return;
}

Assistant:

CVmObjGramProd::CVmObjGramProd(VMG0_)
{
    /* allocate our extension structure from the variable heap */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(sizeof(vm_gram_ext), this);

    /* we have no image data yet */
    get_ext()->image_data_ = 0;
    get_ext()->image_data_size_ = 0;

    /* we haven't been modified yet */
    get_ext()->modified_ = FALSE;

    /* we haven't set up our alternatives yet */
    get_ext()->alts_ = 0;
    get_ext()->alt_cnt_ = 0;
    get_ext()->alt_alo_ = 0;

    /* we haven't cached any hash values yet */
    get_ext()->hashes_cached_ = FALSE;
    get_ext()->comparator_ = VM_INVALID_OBJ;

    /* presume we have no circular rules */
    get_ext()->has_circular_alt = FALSE;

    /* create our memory pool */
    get_ext()->mem_ = new CVmGramProdMem();

    /* 
     *   allocate initial property enumeration space (we'll expand this as
     *   needed, so the initial size is just a guess) 
     */
    get_ext()->prop_enum_max_ = 64;
    get_ext()->prop_enum_arr_ = (vmgram_match_info *)
                                t3malloc(get_ext()->prop_enum_max_
                                         * sizeof(vmgram_match_info));
}